

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdInitializeMultisigSign(void *handle,void **multisign_handle)

{
  void *pvVar1;
  CfdException *this;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  if (multisign_handle != (void **)0x0) {
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"MultisigSign","");
    pvVar1 = cfd::capi::AllocBuffer((string *)local_50,0x15cc);
    *multisign_handle = pvVar1;
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_);
    }
    return 0;
  }
  local_50._0_8_ = "cfdcapi_transaction.cpp";
  local_50._8_4_ = 0x761;
  local_50._16_8_ = "CfdInitializeMultisigSign";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"multisig sign handle is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. multisig sign handle is null.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeMultisigSign(void* handle, void** multisign_handle) {
  try {
    cfd::Initialize();
    if (multisign_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "multisig sign handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. multisig sign handle is null.");
    }

    *multisign_handle =
        AllocBuffer(kPrefixMultisigSignData, sizeof(CfdCapiMultisigSignData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}